

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNext
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptString *instance;
  undefined4 *puVar4;
  
  instance = MoveAndGetNextFromEnumerator(this,propertyId,attributes);
  if (instance == (JavascriptString *)0x0) {
    instance = DynamicObjectPropertyEnumerator::MoveAndGetNext
                         (&this->propertyEnumerator,propertyId,attributes);
  }
  if (instance != (JavascriptString *)0x0) {
    BVar3 = CrossSite::NeedMarshalVar(instance,(this->propertyEnumerator).scriptContext.ptr);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/JavascriptStaticEnumerator.cpp"
                                  ,0x5a,
                                  "(!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext()))"
                                  ,
                                  "!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return instance;
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        JavascriptString * currentIndex = MoveAndGetNextFromEnumerator(propertyId, attributes);
        if (currentIndex == nullptr)
        {
            currentIndex = propertyEnumerator.MoveAndGetNext(propertyId, attributes);
        }
        Assert(!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext()));
        return currentIndex;
    }